

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake2.cpp
# Opt level: O1

void __thiscall
UnixMakefileGenerator::writeSubTargets
          (UnixMakefileGenerator *this,QTextStream *t,QList<MakefileGenerator::SubTarget_*> targets,
          int flags)

{
  long lVar1;
  QMakeProject *this_00;
  QList<MakefileGenerator::SubTarget_*> targets_00;
  int *piVar2;
  Data *pDVar3;
  qsizetype qVar4;
  Data *pDVar5;
  char cVar6;
  QTextStream *pQVar7;
  QTextStream *this_01;
  undefined4 in_register_00000014;
  long *plVar8;
  char16_t *pcVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  UnixMakefileGenerator *pUVar13;
  UnixMakefileGenerator *this_02;
  UnixMakefileGenerator *this_03;
  undefined8 in_stack_fffffffffffffdd0;
  long *plVar14;
  qsizetype in_stack_fffffffffffffdd8;
  QStringBuilder<QString_&,_QString_&> local_200;
  QString local_1f0;
  QString local_1d8;
  QString local_1b8;
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString>,_const_char_(&)[28]>,_QString>
  local_198;
  QString local_158;
  QArrayData *local_138;
  char16_t *pcStack_130;
  qsizetype local_128;
  QString local_118;
  QString local_f8;
  QString local_d8;
  undefined1 local_b8 [48];
  QString local_88;
  QString local_68;
  QArrayData *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  plVar8 = (long *)CONCAT44(in_register_00000014,flags);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = (QArrayData *)*plVar8;
  local_48 = plVar8[1];
  local_40 = plVar8[2];
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  targets_00.d.ptr = (SubTarget **)in_stack_fffffffffffffdd0;
  targets_00.d.d = (Data *)this;
  targets_00.d.size = in_stack_fffffffffffffdd8;
  MakefileGenerator::writeSubTargets(&this->super_MakefileGenerator,t,targets_00,(int)&local_50);
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,8,0x10);
    }
  }
  pQVar7 = (QTextStream *)QTextStream::operator<<(t,"dist: distdir FORCE");
  Qt::endl(pQVar7);
  QTextStream::operator<<
            (t,
             "\t(cd `dirname $(DISTDIR)` && $(TAR) $(DISTNAME).tar $(DISTNAME) && $(COMPRESS) $(DISTNAME).tar) && $(MOVE) `dirname $(DISTDIR)`/$(DISTNAME).tar.gz . && $(DEL_FILE) -r $(DISTDIR)"
            );
  pQVar7 = (QTextStream *)Qt::endl(t);
  Qt::endl(pQVar7);
  QTextStream::operator<<(t,"distdir:");
  plVar14 = plVar8;
  if (plVar8[2] != 0) {
    uVar10 = 0;
    do {
      lVar1 = *(long *)(plVar8[1] + uVar10 * 8);
      plVar8 = plVar14;
      pQVar7 = (QTextStream *)QTextStream::operator<<(t," ");
      plVar14 = plVar8;
      pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)(lVar1 + 0x60));
      QTextStream::operator<<(pQVar7,"-distdir");
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)plVar8[2]);
  }
  pQVar7 = (QTextStream *)QTextStream::operator<<(t," FORCE\n\t");
  QVar11.m_data = (storage_type *)0xa;
  QVar11.m_size = (qsizetype)&local_198;
  QString::fromUtf8(QVar11);
  local_68.d.d = (Data *)local_198.a.a.a;
  local_68.d.ptr = (char16_t *)local_198.a.a.b.d.d;
  local_68.d.size = (qsizetype)local_198.a.a.b.d.ptr;
  pUVar13 = this;
  MakefileGenerator::mkdir_p_asstring
            ((QString *)local_b8,&this->super_MakefileGenerator,&local_68,false);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)local_b8);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,"\n\t");
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,"$(COPY_FILE) --parents ");
  ProKey::ProKey((ProKey *)&local_198,"DISTFILES");
  MakefileGenerator::fileVar(&local_88,&this->super_MakefileGenerator,(ProKey *)&local_198);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&local_88);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7," $(DISTDIR)");
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&Option::dir_sep);
  pQVar7 = (QTextStream *)Qt::endl(pQVar7);
  Qt::endl(pQVar7);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_198.a.a.a != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)*local_198.a.a.a)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)*local_198.a.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)*local_198.a.a.a)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_198.a.a.a,2,0x10);
    }
  }
  if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
    }
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = (pUVar13->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_b8,"QMAKE_ABSOLUTE_SOURCE_PATH");
  QMakeEvaluator::first((ProString *)&local_198,&this_00->super_QMakeEvaluator,(ProKey *)local_b8);
  ProString::toQString(&local_68,(ProString *)&local_198);
  if ((QArrayData *)local_198.a.a.a != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)*local_198.a.a.a)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)*local_198.a.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)*local_198.a.a.a)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_198.a.a.a,2,0x10);
    }
  }
  if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
    }
  }
  if (plVar8[2] != 0) {
    uVar10 = 0;
    do {
      lVar1 = *(long *)(plVar8[1] + uVar10 * 8);
      local_88.d.d = *(Data **)(lVar1 + 0x18);
      local_88.d.ptr = *(char16_t **)(lVar1 + 0x20);
      local_88.d.size = *(long *)(lVar1 + 0x28);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      plVar8 = plVar14;
      pQVar7 = t;
      if ((local_88.d.size != 0) &&
         (cVar6 = QString::endsWith((QString *)&local_88,0x2e2bf0), plVar8 = plVar14, pQVar7 = t,
         cVar6 == '\0')) {
        QString::append((QString *)&local_88);
        plVar8 = plVar14;
        pQVar7 = t;
      }
      local_d8.d.d = *(Data **)(lVar1 + 0x30);
      local_d8.d.ptr = *(char16_t **)(lVar1 + 0x38);
      local_d8.d.size = *(long *)(lVar1 + 0x40);
      if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if ((local_d8.d.size != 0) &&
         (cVar6 = QString::endsWith((QString *)&local_d8,0x2e2bf0), cVar6 == '\0')) {
        QString::append((QString *)&local_d8);
      }
      if (((undefined1 *)local_68.d.size != (undefined1 *)0x0) &&
         (cVar6 = QString::startsWith((QString *)&local_d8,(CaseSensitivity)&local_68),
         cVar6 != '\0')) {
        QString::mid((longlong)&local_118,(longlong)&local_d8);
        local_198.a.a.b.d.size = local_118.d.size;
        local_198.a.a.b.d.ptr = local_118.d.ptr;
        local_198.a.a.b.d.d = local_118.d.d;
        local_198.a.a.a = (char (*) [8])&Option::output_dir;
        local_118.d.d = (Data *)0x0;
        local_118.d.ptr = (char16_t *)0x0;
        local_118.d.size = 0;
        QStringBuilder<QString_&,_QString>::convertTo<QString>
                  (&local_f8,(QStringBuilder<QString_&,_QString> *)&local_198);
        pcVar9 = local_d8.d.ptr;
        pDVar5 = local_d8.d.d;
        qVar4 = local_f8.d.size;
        pDVar3 = local_f8.d.d;
        local_f8.d.d = local_d8.d.d;
        local_d8.d.d = pDVar3;
        local_d8.d.ptr = local_f8.d.ptr;
        local_f8.d.ptr = pcVar9;
        local_f8.d.size = local_d8.d.size;
        local_d8.d.size = qVar4;
        if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
          }
        }
        if (&(local_198.a.a.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_198.a.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_198.a.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + -1;
          UNLOCK();
          if (((local_198.a.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_198.a.a.b.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      local_f8.d.d = local_d8.d.d;
      local_f8.d.ptr = local_d8.d.ptr;
      local_f8.d.size = local_d8.d.size;
      if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      cVar6 = QString::endsWith((QString *)&local_f8,0x2e2bf0);
      if (cVar6 != '\0') {
        QString::chop((longlong)&local_f8);
      }
      cVar6 = QString::startsWith((QString *)&local_f8,0x2e2bf0);
      if (cVar6 == '\0') {
        pcVar9 = Option::dir_sep.d.ptr;
        if (Option::dir_sep.d.ptr == (char16_t *)0x0) {
          pcVar9 = (char16_t *)&QString::_empty;
        }
        QString::insert((longlong)&local_f8,(QChar *)0x0,(longlong)pcVar9);
      }
      local_118.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_118.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_118.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      if (local_d8.d.size == 0) {
        QVar12.m_data = (storage_type *)0x2;
        QVar12.m_size = (qsizetype)&local_198;
        QString::fromUtf8(QVar12);
        local_118.d.d = (Data *)local_198.a.a.a;
        local_118.d.ptr = (char16_t *)local_198.a.a.b.d.d;
        local_118.d.size = (qsizetype)local_198.a.a.b.d.ptr;
        plVar14 = plVar8;
      }
      else {
        (*(pUVar13->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
          [0xc])(&local_138,pUVar13,&local_d8);
        local_b8._24_8_ = local_128;
        local_b8._16_8_ = pcStack_130;
        local_b8._8_8_ = local_138;
        local_128 = 0;
        local_b8._0_8_ = "\n\tcd ";
        local_138 = (QArrayData *)0x0;
        pcStack_130 = (char16_t *)0x0;
        local_b8._32_8_ = " && ";
        QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]>::
        convertTo<QString>(&local_118,
                           (QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]>
                            *)local_b8);
        plVar14 = plVar8;
        if ((QArrayData *)local_b8._8_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_b8._8_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_b8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_b8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_b8._8_8_,2,0x10);
          }
        }
        if (local_138 != (QArrayData *)0x0) {
          LOCK();
          (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_138,2,0x10);
          }
        }
      }
      local_158.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_158.d.d._0_4_ = 0xaaaaaaaa;
      local_158.d.d._4_4_ = 0xaaaaaaaa;
      local_158.d.ptr._0_4_ = 0xaaaaaaaa;
      local_158.d.ptr._4_4_ = 0xaaaaaaaa;
      this_02 = pUVar13;
      (*(pUVar13->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                (&local_1b8,pUVar13,lVar1 + 0x78);
      qVar4 = local_1b8.d.size;
      pcVar9 = local_1b8.d.ptr;
      pDVar3 = local_1b8.d.d;
      local_1b8.d.size = 0;
      local_1b8.d.d = (Data *)0x0;
      local_1b8.d.ptr = (char16_t *)0x0;
      (*(pUVar13->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                (&local_1d8,pUVar13,&local_f8);
      local_198.b.d.size = local_1d8.d.size;
      local_198.b.d.ptr = local_1d8.d.ptr;
      local_198.b.d.d = local_1d8.d.d;
      local_198.a.a.a = (char (*) [8])0x2aa85b;
      local_198.a.a.b.d.d = pDVar3;
      local_198.a.a.b.d.ptr = pcVar9;
      local_198.a.a.b.d.size = qVar4;
      local_198.a.b = (char (*) [28])0x2aa863;
      local_1d8.d.d = (Data *)0x0;
      local_1d8.d.ptr = (char16_t *)0x0;
      local_1d8.d.size = 0;
      QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString>,_const_char_(&)[28]>,_QString>
      ::convertTo<QString>(&local_158,&local_198);
      QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString>,_const_char_(&)[28]>,_QString>
      ::~QStringBuilder(&local_198);
      if (&(local_1d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_1d8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_1b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_1b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_1b8.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_198.a.a.a = *(char (**) [8])(lVar1 + 0x78);
      local_198.a.a.b.d.d = *(Data **)(lVar1 + 0x80);
      local_198.a.a.b.d.ptr = *(char16_t **)(lVar1 + 0x88);
      if ((QArrayData *)local_198.a.a.a != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_198.a.a.a)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_198.a.a.a)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_1b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_1b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_1b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_200.b = (QString *)(lVar1 + 0x48);
      local_200.a = &local_88;
      t = pQVar7;
      QStringBuilder<QString_&,_QString_&>::convertTo<QString>(&local_1f0,&local_200);
      this_03 = this_02;
      MakefileGenerator::fileFixify
                (&local_1d8,&this_02->super_MakefileGenerator,&local_1f0,(FileFixifyTypes)0x4,true);
      (*(this_02->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                (&local_1b8,this_02,&local_1d8);
      if (&(local_1d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_1d8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_1f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_1f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_1f0.d.d)->super_QArrayData,2,0x10);
        }
      }
      cVar6 = QString::startsWith((QString *)&local_198,(CaseSensitivity)&local_88);
      if (cVar6 != '\0') {
        QString::remove((longlong)&local_198,0);
      }
      this_01 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)(lVar1 + 0x60));
      QTextStream::operator<<(this_01,"-distdir: FORCE");
      pUVar13 = this_03;
      (*(this_03->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                (&local_1d8,this_03,&local_198);
      MakefileGenerator::writeSubTargetCall
                (&this_03->super_MakefileGenerator,pQVar7,&local_88,&local_1b8,&local_d8,&local_1d8,
                 &local_118,&local_158);
      if (&(local_1d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_1d8.d.d)->super_QArrayData,2,0x10);
        }
      }
      Qt::endl(pQVar7);
      if (&(local_1b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_1b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_1b8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_198.a.a.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)*local_198.a.a.a)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)*local_198.a.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)*local_198.a.a.a)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_198.a.a.a,2,0x10);
        }
      }
      piVar2 = (int *)CONCAT44(local_158.d.d._4_4_,local_158.d.d._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_158.d.d._4_4_,local_158.d.d._0_4_),2,0x10);
        }
      }
      if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)plVar8[2]);
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void
UnixMakefileGenerator::writeSubTargets(QTextStream &t, QList<MakefileGenerator::SubTarget*> targets, int flags)
{
    MakefileGenerator::writeSubTargets(t, targets, flags);

    t << "dist: distdir FORCE" << Qt::endl;
    t << "\t(cd `dirname $(DISTDIR)` && $(TAR) $(DISTNAME).tar $(DISTNAME) && $(COMPRESS) $(DISTNAME).tar)"
         " && $(MOVE) `dirname $(DISTDIR)`/$(DISTNAME).tar.gz . && $(DEL_FILE) -r $(DISTDIR)";
    t << Qt::endl << Qt::endl;

    t << "distdir:";
    for (int target = 0; target < targets.size(); ++target) {
        SubTarget *subtarget = targets.at(target);
        t << " " << subtarget->target << "-distdir";
    }
    t << " FORCE\n\t"
      << mkdir_p_asstring("$(DISTDIR)", false) << "\n\t"
      << "$(COPY_FILE) --parents " << fileVar("DISTFILES") << " $(DISTDIR)" << Option::dir_sep << Qt::endl << Qt::endl;

    const QString abs_source_path = project->first("QMAKE_ABSOLUTE_SOURCE_PATH").toQString();
    for (int target = 0; target < targets.size(); ++target) {
        SubTarget *subtarget = targets.at(target);
        QString in_directory = subtarget->in_directory;
        if (!in_directory.isEmpty() && !in_directory.endsWith(Option::dir_sep))
            in_directory += Option::dir_sep;
        QString out_directory = subtarget->out_directory;
        if (!out_directory.isEmpty() && !out_directory.endsWith(Option::dir_sep))
            out_directory += Option::dir_sep;
        if (!abs_source_path.isEmpty() && out_directory.startsWith(abs_source_path))
            out_directory = Option::output_dir + out_directory.mid(abs_source_path.size());

        QString dist_directory = out_directory;
        if (dist_directory.endsWith(Option::dir_sep))
            dist_directory.chop(Option::dir_sep.size());
        if (!dist_directory.startsWith(Option::dir_sep))
            dist_directory.prepend(Option::dir_sep);

        QString out_directory_cdin = out_directory.isEmpty() ? QString("\n\t")
                                                             : "\n\tcd " + escapeFilePath(out_directory) + " && ";
        QString makefilein = " -e -f " + escapeFilePath(subtarget->makefile)
                + " distdir DISTDIR=$(DISTDIR)" + escapeFilePath(dist_directory);

        QString out = subtarget->makefile;
        QString in = escapeFilePath(fileFixify(in_directory + subtarget->profile, FileFixifyAbsolute));
        if (out.startsWith(in_directory))
            out.remove(0, in_directory.size());

        t << subtarget->target << "-distdir: FORCE";
        writeSubTargetCall(t, in_directory, in, out_directory, escapeFilePath(out),
                           out_directory_cdin, makefilein);
        t << Qt::endl;
    }
}